

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

void uavs3d_funs_init_c(void)

{
  uavs3d_funs_init_mc_c();
  uavs3d_funs_init_deblock_c();
  uavs3d_funs_init_sao_c();
  uavs3d_funs_init_alf_c();
  uavs3d_funs_init_intra_pred_c();
  uavs3d_funs_init_pixel_opt_c();
  uavs3d_funs_init_recon_c();
  uavs3d_funs_init_itrans_c();
  return;
}

Assistant:

void uavs3d_funs_init_c() {
    uavs3d_funs_init_mc_c();
    uavs3d_funs_init_deblock_c();
    uavs3d_funs_init_sao_c();
    uavs3d_funs_init_alf_c();
    uavs3d_funs_init_intra_pred_c();
    uavs3d_funs_init_pixel_opt_c();
    uavs3d_funs_init_recon_c();
    uavs3d_funs_init_itrans_c();
}